

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::nameSpecStruct(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  undefined8 *puVar5;
  AST *pAVar6;
  RefAST RVar7;
  NoViableAltException *pNVar8;
  AST *pAVar9;
  RefCount<Token> *this_01;
  RefAST tmp72_AST;
  RefAST tmp70_AST;
  RefAST nameSpecStruct_AST;
  RefAST tmp71_AST;
  RefAST I_AST;
  RefAST X_AST;
  RefAST N_AST;
  ASTPair currentAST;
  RefToken I;
  RefToken N;
  undefined1 local_f8 [16];
  RefCount<AST> local_e8;
  undefined1 local_e0 [16];
  RefCount<AST> local_d0;
  RefCount<AST> local_c8;
  RefCount<AST> local_c0;
  ASTPair local_b8;
  ASTFactory local_a0;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefCount<AST> local_70;
  RefCount<AST> local_68;
  RefCount<AST> local_60;
  RefToken local_58;
  RefToken local_50;
  RefToken local_48;
  RefCount<Token> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_d0.ref = nullAST.ref;
  local_b8.root.ref = (Ref *)0x0;
  local_b8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_e8.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
    local_e8.ref = local_d0.ref;
  }
  local_80.ref = nullToken.ref;
  if (nullToken.ref == (Ref *)0x0) {
    local_78.ref = (Ref *)0x0;
  }
  else {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
    local_78.ref = local_80.ref;
  }
  if (local_d0.ref == (Ref *)0x0) {
    local_c0.ref = (Ref *)0x0;
  }
  else {
    (local_d0.ref)->count = (local_d0.ref)->count + 1;
    local_c0.ref = local_d0.ref;
  }
  if (local_80.ref == (Ref *)0x0) {
    local_80.ref = (Ref *)0x0;
  }
  else {
    (local_80.ref)->count = (local_80.ref)->count + 1;
  }
  if (local_d0.ref == (Ref *)0x0) {
    local_d0.ref = (Ref *)0x0;
  }
  else {
    uVar1 = (local_d0.ref)->count;
    (local_d0.ref)->count = uVar1 + 1;
    (local_d0.ref)->count = uVar1 + 2;
  }
  local_c8.ref = local_d0.ref;
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xd) {
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(local_f8 + 8,this,1);
    RefCount<Token>::operator=(&local_80,(RefCount<Token> *)(local_f8 + 8));
    RefCount<Token>::~RefCount((RefCount<Token> *)(local_f8 + 8));
    if (local_80.ref == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      (local_80.ref)->count = (local_80.ref)->count + 1;
      local_40.ref = local_80.ref;
    }
    ASTFactory::create((ASTFactory *)(local_f8 + 8),
                       (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
    RefCount<AST>::operator=(&local_d0,(RefCount<AST> *)(local_f8 + 8));
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_f8 + 8));
    this_01 = &local_40;
  }
  else {
    if (iVar3 != 0x11) {
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_48);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(local_f8 + 8,this,1);
    RefCount<Token>::operator=(&local_78,(RefCount<Token> *)(local_f8 + 8));
    RefCount<Token>::~RefCount((RefCount<Token> *)(local_f8 + 8));
    if (local_78.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_78.ref)->count = (local_78.ref)->count + 1;
      local_38.ref = local_78.ref;
    }
    ASTFactory::create((ASTFactory *)(local_f8 + 8),
                       (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
    RefCount<AST>::operator=(&local_c0,(RefCount<AST> *)(local_f8 + 8));
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_f8 + 8));
    this_01 = &local_38;
  }
  RefCount<Token>::~RefCount(this_01);
  Parser::match((Parser *)this,iVar3);
  local_f8._8_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_f8._8_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)(local_e0 + 8),(RefToken *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)(local_f8 + 8),(RefCount<AST> *)(local_e0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_e0 + 8));
  RefCount<Token>::~RefCount(&local_88);
  Parser::match((Parser *)this,0xb);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 != 0xc) {
    if ((iVar3 != 0xd) && (iVar3 != 0x11)) {
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_50);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    nameSpecList(this);
    RefCount<AST>::operator=(&local_c8,this_00);
  }
  local_e0._8_8_ = nullAST.ref;
  if (nullAST.ref == (Ref *)0x0) {
    local_e0._8_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
  ASTFactory::create((ASTFactory *)local_f8,(RefToken *)nodes);
  RefCount<AST>::operator=((RefCount<AST> *)(local_e0 + 8),(RefCount<AST> *)local_f8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_f8);
  RefCount<Token>::~RefCount(&local_90);
  Parser::match((Parser *)this,0xc);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 8) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_17,iVar3);
    if (!bVar2) goto LAB_001933e9;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    RVar7 = nullAST;
    if (!bVar2) goto LAB_001933e9;
    if (nullAST.ref == (Ref *)0x0) {
      RVar7.ref = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    local_f8._0_8_ = RVar7.ref;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0.nodeFactory,this,1);
    ASTFactory::create((ASTFactory *)local_e0,(RefToken *)nodes);
    RefCount<AST>::operator=((RefCount<AST> *)local_f8,(RefCount<AST> *)local_e0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_e0);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_a0.nodeFactory);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_f8);
  }
  else {
LAB_001933e9:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    bVar2 = BitSet::member(&_tokenSet_17,iVar3);
    if (!bVar2) {
LAB_0019377e:
      pNVar8 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar8,&local_58);
      __cxa_throw(pNVar8,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0019377e;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0019377e;
  }
  RefCount<AST>::operator=(&local_e8,&local_b8.root);
  piVar4 = (int *)operator_new(0x20);
  *piVar4 = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  piVar4[6] = 0;
  piVar4[7] = 0;
  puVar5 = (undefined8 *)operator_new(0x20);
  *(undefined8 **)(piVar4 + 2) = puVar5;
  *(undefined8 **)(piVar4 + 4) = puVar5;
  *(undefined8 **)(piVar4 + 6) = puVar5 + 4;
  puVar5[2] = 0;
  puVar5[3] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  *(undefined8 **)(piVar4 + 4) = puVar5 + 4;
  ASTFactory::create(&local_a0,(int)nodes);
  iVar3 = *piVar4;
  *piVar4 = iVar3 + 1;
  RefCount<AST>::operator=
            ((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar4 + 2)),(RefCount<AST> *)&local_a0);
  if (local_c0.ref == (Ref *)0x0) {
    local_60.ref = (Ref *)0x0;
  }
  else {
    (local_c0.ref)->count = (local_c0.ref)->count + 1;
    local_60.ref = local_c0.ref;
  }
  iVar3 = *piVar4;
  *piVar4 = iVar3 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar4 + 2)),&local_60);
  if (local_d0.ref == (Ref *)0x0) {
    local_68.ref = (Ref *)0x0;
  }
  else {
    (local_d0.ref)->count = (local_d0.ref)->count + 1;
    local_68.ref = local_d0.ref;
  }
  iVar3 = *piVar4;
  *piVar4 = iVar3 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar4 + 2)),&local_68);
  if (local_c8.ref == (Ref *)0x0) {
    local_70.ref = (Ref *)0x0;
  }
  else {
    (local_c8.ref)->count = (local_c8.ref)->count + 1;
    local_70.ref = local_c8.ref;
  }
  iVar3 = *piVar4;
  *piVar4 = iVar3 + 1;
  RefCount<AST>::operator=((RefCount<AST> *)((long)iVar3 * 8 + *(long *)(piVar4 + 2)),&local_70);
  ASTFactory::make((ASTFactory *)local_f8,(ASTArray *)nodes);
  RefCount<AST>::operator=(&local_e8,(RefCount<AST> *)local_f8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_f8);
  RefCount<AST>::~RefCount(&local_70);
  RefCount<AST>::~RefCount(&local_68);
  RefCount<AST>::~RefCount(&local_60);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_a0);
  RefCount<AST>::operator=(&local_b8.root,&local_e8);
  if (local_e8.ref == (Ref *)0x0) {
    pAVar6 = (AST *)0x0;
  }
  else {
    pAVar6 = (local_e8.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar9 = (AST *)0x0;
  }
  else {
    pAVar9 = (nullAST.ref)->ptr;
  }
  bVar2 = pAVar6 != pAVar9;
  if (bVar2) {
    AST::getFirstChild((local_e8.ref)->ptr);
    if ((Ref *)local_e0._0_8_ == (Ref *)0x0) {
      pAVar6 = (AST *)0x0;
    }
    else {
      pAVar6 = *(AST **)local_e0._0_8_;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar9 = (AST *)0x0;
    }
    else {
      pAVar9 = (nullAST.ref)->ptr;
    }
    if (pAVar6 != pAVar9) {
      bVar2 = true;
      AST::getFirstChild((local_e8.ref)->ptr);
      goto LAB_00193664;
    }
  }
  if (local_e8.ref == (Ref *)0x0) {
    local_f8._0_8_ = (Ref *)0x0;
  }
  else {
    (local_e8.ref)->count = (local_e8.ref)->count + 1;
    local_f8._0_8_ = local_e8.ref;
  }
LAB_00193664:
  RefCount<AST>::operator=(&local_b8.child,(RefCount<AST> *)local_f8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_f8);
  if (bVar2) {
    RefCount<AST>::~RefCount((RefCount<AST> *)local_e0);
  }
  ASTPair::advanceChildToEnd(&local_b8);
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_e0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_f8 + 8));
  RefCount<AST>::operator=(this_00,&local_e8);
  RefCount<AST>::~RefCount(&local_c8);
  RefCount<AST>::~RefCount(&local_d0);
  RefCount<Token>::~RefCount(&local_80);
  RefCount<AST>::~RefCount(&local_c0);
  RefCount<Token>::~RefCount(&local_78);
  RefCount<AST>::~RefCount(&local_e8);
  RefCount<AST>::~RefCount(&local_b8.child);
  RefCount<AST>::~RefCount(&local_b8.root);
  return;
}

Assistant:

void GrpParser::nameSpecStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST nameSpecStruct_AST = nullAST;
	RefToken  N = nullToken;
	RefAST N_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_INT:
		{
			N = LT(1);
			N_AST = astFactory.create(N);
			match(LIT_INT);
			break;
		}
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp70_AST = nullAST;
		tmp70_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LIT_INT:
		{
			nameSpecList();
			X_AST = returnAST;
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp71_AST = nullAST;
		tmp71_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_17.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp72_AST = nullAST;
			tmp72_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_17.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		nameSpecStruct_AST = currentAST.root;
		nameSpecStruct_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZdotStruct))->add(N_AST)->add(I_AST)->add(X_AST));
		currentAST.root = nameSpecStruct_AST;
		currentAST.child = nameSpecStruct_AST!=nullAST &&nameSpecStruct_AST->getFirstChild()!=nullAST ?
			nameSpecStruct_AST->getFirstChild() : nameSpecStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_17);
	}
	returnAST = nameSpecStruct_AST;
}